

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9Texture.cpp
# Opt level: O2

uint32_t __thiscall
GmmLib::GmmGen9TextureCalc::Get2DMipMapTotalHeight
          (GmmGen9TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo)

{
  uint32_t UnitAlignment;
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  uint uVar7;
  
  uVar3 = pTexInfo->MaxLod;
  if (((*(ushort *)&(pTexInfo->Flags).Info.field_0x4 & 0x1060) != 0) &&
     (uVar6 = (pTexInfo->Alignment).MipTailStartLod, uVar6 <= uVar3)) {
    uVar3 = uVar6;
  }
  UnitAlignment = (pTexInfo->Alignment).VAlign;
  uVar4 = 1;
  if (((ulong)(pTexInfo->Flags).Gpu & 0x20000040) != 0) {
    uVar4 = (pTexInfo->MSAA).NumSamples;
  }
  uVar1 = GmmTextureCalc::ExpandHeight
                    (&this->super_GmmTextureCalc,pTexInfo->BaseHeight,UnitAlignment,uVar4);
  uVar4 = 0;
  uVar7 = 0;
  for (uVar6 = 1; uVar6 <= uVar3; uVar6 = uVar6 + 1) {
    uVar2 = (*(this->super_GmmTextureCalc)._vptr_GmmTextureCalc[0x19])(this,pTexInfo,(ulong)uVar6);
    uVar5 = 1;
    if (((ulong)(pTexInfo->Flags).Gpu & 0x20000040) != 0) {
      uVar5 = (pTexInfo->MSAA).NumSamples;
    }
    uVar2 = GmmTextureCalc::ExpandHeight(&this->super_GmmTextureCalc,uVar2,UnitAlignment,uVar5);
    uVar5 = uVar2;
    if (uVar6 == 1) {
      uVar5 = 0;
      uVar4 = uVar2;
    }
    uVar7 = uVar7 + uVar5;
  }
  if (uVar7 < uVar4) {
    uVar7 = uVar4;
  }
  return uVar7 + uVar1;
}

Assistant:

uint32_t GmmLib::GmmGen9TextureCalc::Get2DMipMapTotalHeight(GMM_TEXTURE_INFO *pTexInfo)
{
    uint32_t BlockHeight, MipHeight;
    uint32_t HeightLinesLevel0, HeightLinesLevel1, HeightLinesLevel2;
    uint32_t i, MipLevel, VAlign;
    uint32_t AlignedHeightLines;

    GMM_DPF_ENTER;

    MipHeight = pTexInfo->BaseHeight;
    MipLevel  = pTexInfo->MaxLod;
    VAlign    = pTexInfo->Alignment.VAlign;

    MipLevel =
    (pTexInfo->Flags.Info.TiledYf || GMM_IS_64KB_TILE(pTexInfo->Flags)) ?
    GFX_MIN(MipLevel, pTexInfo->Alignment.MipTailStartLod) :
    MipLevel;


    HeightLinesLevel0 = __GMM_EXPAND_HEIGHT(this, MipHeight, VAlign, pTexInfo);

    // Mip0 height...
    BlockHeight = HeightLinesLevel0;

    // Height of Mip1 and Mip2..n needed later...
    HeightLinesLevel1 = HeightLinesLevel2 = 0;
    for(i = 1; i <= MipLevel; i++)
    {
        MipHeight = GmmTexGetMipHeight(pTexInfo, i);

        AlignedHeightLines = __GMM_EXPAND_HEIGHT(this, MipHeight, VAlign, pTexInfo);

        if(i == 1)
        {
            HeightLinesLevel1 = AlignedHeightLines;
        }
        else
        {
            HeightLinesLevel2 += AlignedHeightLines;
        }
    }

    // If Mip1 height covers all others, then that is all we need...
    if(HeightLinesLevel1 >= HeightLinesLevel2)
    {
        BlockHeight += HeightLinesLevel1;
    }
    else
    {
        BlockHeight += HeightLinesLevel2;
    }

    GMM_DPF_EXIT;

    return (BlockHeight);
}